

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

void calc_data_crc(RK_U8 *dat,RK_U32 len,DataCrc *crc)

{
  RK_U8 local_48 [4];
  uint local_44;
  RK_U32 val;
  RK_U32 xor;
  RK_U32 *dat32;
  RK_U8 *dat8;
  RK_U32 grp_loop;
  RK_U32 i;
  RK_ULONG data_grp_byte_cnt;
  DataCrc *crc_local;
  RK_U8 *pRStack_10;
  RK_U32 len_local;
  RK_U8 *dat_local;
  
  _grp_loop = 0x400000004;
  dat8._4_4_ = 0;
  dat32 = (RK_U32 *)0x0;
  _val = 0;
  local_44 = 0;
  crc->sum_cnt = (RK_U32)(((ulong)len + 0x400000003) / 0x400000004);
  data_grp_byte_cnt = (RK_ULONG)crc;
  crc_local._4_4_ = len;
  pRStack_10 = dat;
  for (dat8._0_4_ = 0; (ulong)(uint)dat8 < crc_local._4_4_ / _grp_loop; dat8._0_4_ = (uint)dat8 + 1)
  {
    wide_bit_sum(pRStack_10 + (uint)dat8 * _grp_loop,(RK_U32)_grp_loop,
                 (RK_ULONG *)(*(long *)(data_grp_byte_cnt + 8) + (ulong)(uint)dat8 * 8));
  }
  if ((ulong)crc_local._4_4_ % _grp_loop != 0) {
    wide_bit_sum(pRStack_10 + (uint)dat8 * _grp_loop,(RK_U32)((ulong)crc_local._4_4_ % _grp_loop),
                 (RK_ULONG *)(*(long *)(data_grp_byte_cnt + 8) + (ulong)(uint)dat8 * 8));
  }
  for (dat8._4_4_ = 0; dat8._4_4_ < crc_local._4_4_ >> 2; dat8._4_4_ = dat8._4_4_ + 1) {
    local_44 = *(uint *)(pRStack_10 + (ulong)dat8._4_4_ * 4) ^ local_44;
  }
  if ((crc_local._4_4_ & 3) != 0) {
    for (dat8._4_4_ = crc_local._4_4_ & 0xfffffffc; dat8._4_4_ < crc_local._4_4_;
        dat8._4_4_ = dat8._4_4_ + 1) {
      local_48[dat8._4_4_ & 3] = pRStack_10[dat8._4_4_];
    }
  }
  *(RK_U32 *)data_grp_byte_cnt = crc_local._4_4_;
  *(uint *)(data_grp_byte_cnt + 0x10) = local_44;
  return;
}

Assistant:

void calc_data_crc(RK_U8 *dat, RK_U32 len, DataCrc *crc)
{
    RK_ULONG data_grp_byte_cnt = MAX_HALF_WORD_SUM_CNT * CAL_BYTE;
    RK_U32 i = 0, grp_loop = 0;
    RK_U8 *dat8 = NULL;
    RK_U32 *dat32 = NULL;
    RK_U32 xor = 0;

    /*calc sum */
    crc->sum_cnt = (len + data_grp_byte_cnt - 1) / data_grp_byte_cnt;
    for (grp_loop = 0; grp_loop < len / data_grp_byte_cnt; grp_loop++) {
        wide_bit_sum(&dat[grp_loop * data_grp_byte_cnt], data_grp_byte_cnt, &crc->sum[grp_loop]);
    }
    if (len % data_grp_byte_cnt) {
        wide_bit_sum(&dat[grp_loop * data_grp_byte_cnt], len % data_grp_byte_cnt, &crc->sum[grp_loop]);
    }

    /*calc xor */
    dat32 = (RK_U32 *)dat;
    for (i = 0; i < len / 4; i++)
        xor ^= dat32[i];

    if (len % 4) {
        RK_U32 val = 0;
        dat8 = (RK_U8 *)&val;
        for (i = (len / 4) * 4; i < len; i++)
            dat8[i % 4] = dat[i];
        xor ^= val;
    }

    crc->len = len;
    crc->vor = xor;
}